

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

shared_ptr<chatra::Node> __thiscall
chatra::parseAsLiteral(chatra *this,ParserContext *ct,Token *token)

{
  string *str;
  size_type *psVar1;
  char cVar2;
  TokenType TVar3;
  StringId SVar4;
  undefined1 *puVar5;
  _Head_base<0UL,_chatra::Literal_*,_false> __p;
  bool bVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  undefined8 *puVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  pointer index;
  pointer pcVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  shared_ptr<chatra::Node> sVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  pointer local_e0;
  size_t idx;
  shared_ptr<chatra::Node> *n;
  undefined1 local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 auStack_88 [8];
  string ret_1;
  undefined1 local_60 [8];
  string targetStr;
  _Head_base<0UL,_chatra::Literal_*,_false> local_38;
  unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_> value;
  
  str = &token->literal;
  idx = (size_t)this;
  targetStr.field_2._8_8_ = ct;
  local_38._M_head_impl = (Literal *)operator_new(0x30);
  ((local_38._M_head_impl)->vString)._M_dataplus._M_p = (pointer)0x0;
  ((local_38._M_head_impl)->vString)._M_string_length = 0;
  ((local_38._M_head_impl)->vString).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&((local_38._M_head_impl)->vString).field_2 + 8) = 0;
  *(undefined8 *)local_38._M_head_impl = 0;
  ((local_38._M_head_impl)->field_1).vInt = 0;
  ((local_38._M_head_impl)->vString)._M_dataplus._M_p =
       (pointer)&((local_38._M_head_impl)->vString).field_2;
  ((local_38._M_head_impl)->vString).field_2._M_local_buf[0] = '\0';
  TVar3 = token->type;
  if (TVar3 != String) {
    if (TVar3 == Name) {
      SVar4 = token->sid;
      if (SVar4 == Null) {
        (local_38._M_head_impl)->type = Null;
      }
      else {
        (local_38._M_head_impl)->type = Bool;
        if (1 < SVar4 - True) {
          std::__cxx11::string::string
                    ((string *)local_60,"invalid boolean constant",(allocator *)&local_a8);
          auStack_88 = (undefined1  [8])0x0;
          ret_1._M_dataplus._M_p = (pointer)0x0;
          ret_1._M_string_length = 0;
          ParserContext::errorAtToken
                    ((ParserContext *)targetStr.field_2._8_8_,Error,token,(string *)local_60,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_88);
          std::__cxx11::string::~string((string *)local_60);
        }
        ((local_38._M_head_impl)->field_1).vBool = SVar4 == True;
      }
    }
    else {
      if (TVar3 != Number) {
        std::__cxx11::string::string((string *)local_60,"internal error",(allocator *)&local_a8);
        auStack_88 = (undefined1  [8])0x0;
        ret_1._M_dataplus._M_p = (pointer)0x0;
        ret_1._M_string_length = 0;
        ParserContext::errorAtToken
                  ((ParserContext *)targetStr.field_2._8_8_,Error,token,(string *)local_60,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_88);
        std::__cxx11::string::~string((string *)local_60);
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar11 = &PTR__exception_0023d4d0;
        __cxa_throw(puVar11,&AbortCompilingException::typeinfo,std::exception::~exception);
      }
      bVar6 = startsWith(str,0,"0x");
      if (bVar6) {
        (local_38._M_head_impl)->type = Int;
        uVar7 = parseIntLiteral((ParserContext *)targetStr.field_2._8_8_,token,str,2,"hexadecimal",
                                0x10);
      }
      else {
        bVar6 = startsWith(str,0,"0b");
        if (bVar6) {
          (local_38._M_head_impl)->type = Int;
          uVar7 = parseIntLiteral((ParserContext *)targetStr.field_2._8_8_,token,str,2,"binary",2);
        }
        else {
          lVar8 = std::__cxx11::string::find((char)str,0x2e);
          if (lVar8 != -1) {
            (local_38._M_head_impl)->type = Float;
            std::__cxx11::string::string((string *)local_60,(string *)str);
            while( true ) {
              uVar9 = std::__cxx11::string::find((char)local_60,0x5f);
              if (uVar9 == 0xffffffffffffffff) break;
              std::__cxx11::string::erase((ulong)local_60,uVar9);
            }
            local_e0 = (pointer)0x0;
            n = (shared_ptr<chatra::Node> *)
                std::__cxx11::stod((string *)local_60,(size_t *)&local_e0);
            if (local_e0 < targetStr._M_dataplus._M_p) {
              std::__cxx11::string::string
                        ((string *)local_c8,"invalid digit ${0} in ",
                         (allocator *)(ret_1.field_2._M_local_buf + 0xe));
              std::operator+(&local_a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c8,"floating");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_88,&local_a8," constant");
              std::__cxx11::string::substr((ulong)&local_108,(ulong)local_60);
              __l._M_len = 1;
              __l._M_array = &local_108;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_120,__l,(allocator_type *)(ret_1.field_2._M_local_buf + 0xf));
              ParserContext::errorAtToken
                        ((ParserContext *)targetStr.field_2._8_8_,Error,token,(string *)auStack_88,
                         &local_120);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_120);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)auStack_88);
              std::__cxx11::string::~string((string *)&local_a8);
              std::__cxx11::string::~string((string *)local_c8);
              n = (shared_ptr<chatra::Node> *)0x0;
            }
            std::__cxx11::string::~string((string *)local_60);
            (local_38._M_head_impl)->field_1 = (anon_union_8_3_490f1413_for_Literal_1)n;
            goto LAB_0018b43f;
          }
          (local_38._M_head_impl)->type = Int;
          uVar7 = parseIntLiteral((ParserContext *)targetStr.field_2._8_8_,token,str,0,"decimal",10)
          ;
        }
      }
      ((local_38._M_head_impl)->field_1).vInt = uVar7;
    }
    goto LAB_0018b43f;
  }
  (local_38._M_head_impl)->type = String;
  bVar6 = startsWith(str,0,"\'");
  if (bVar6) {
LAB_0018b156:
    parseStringLiteral((string *)local_60,(ParserContext *)targetStr.field_2._8_8_,token,str,0);
LAB_0018b16c:
    this_00 = (string *)local_60;
  }
  else {
    bVar6 = startsWith(str,0,"\"");
    if (bVar6) goto LAB_0018b156;
    bVar6 = startsWith(str,0,"L\'");
    if (bVar6) {
LAB_0018b26a:
      (local_38._M_head_impl)->type = MultilingualString;
      parseStringLiteral((string *)local_60,(ParserContext *)targetStr.field_2._8_8_,token,str,1);
      goto LAB_0018b16c;
    }
    bVar6 = startsWith(str,0,"L\"");
    if (bVar6) goto LAB_0018b26a;
    bVar6 = startsWith(str,0,"r\'");
    if (bVar6) {
LAB_0018b4c6:
      cVar2 = (token->literal)._M_dataplus._M_p[1];
      local_60 = (undefined1  [8])&targetStr._M_string_length;
      targetStr._M_dataplus._M_p = (pointer)0x0;
      targetStr._M_string_length._0_1_ = 0;
      targetStr.field_2._8_4_ = (int)cVar2;
      for (uVar9 = 2; uVar9 < (token->literal)._M_string_length; uVar9 = uVar9 + sVar10) {
        if ((str->_M_dataplus)._M_p[uVar9] == cVar2) {
          std::__cxx11::string::append((ulong)local_60,'\x01');
          sVar10 = 2;
        }
        else {
          sVar10 = byteCount(str,uVar9);
          _Var12._M_current = (str->_M_dataplus)._M_p + uVar9;
          std::__cxx11::string::
          append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)local_60,_Var12,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var12._M_current + sVar10));
        }
      }
      goto LAB_0018b16c;
    }
    bVar6 = startsWith(str,0,"r\"");
    if (bVar6) goto LAB_0018b4c6;
    bVar6 = startsWith(str,0,"R<<<\n");
    if (!bVar6) goto LAB_0018b43f;
    local_60 = (undefined1  [8])&targetStr._M_string_length;
    targetStr._M_dataplus._M_p = (pointer)0x0;
    targetStr._M_string_length._0_1_ = 0;
    for (index = (pointer)0x5;
        (pcVar13 = (pointer)(token->literal)._M_string_length, index < pcVar13 &&
        ((cVar2 = (str->_M_dataplus)._M_p[(long)index], cVar2 == ' ' || (cVar2 == '\t'))));
        index = index + 1) {
      std::__cxx11::string::append((ulong)local_60,'\x01');
    }
    psVar1 = &ret_1._M_string_length;
    ret_1._M_dataplus._M_p = (pointer)0x0;
    ret_1._M_string_length = ret_1._M_string_length & 0xffffffffffffff00;
    auStack_88 = (undefined1  [8])psVar1;
    while (index < pcVar13) {
      if ((str->_M_dataplus)._M_p[(long)index] == '\n') {
        std::__cxx11::string::append((ulong)auStack_88,'\x01');
        pcVar13 = index + 1;
        if (targetStr._M_dataplus._M_p + (long)index + 1 <=
            (pointer)(token->literal)._M_string_length) {
          bVar6 = std::__equal<true>::equal<char>
                            ((char *)local_60,targetStr._M_dataplus._M_p + (long)local_60,
                             (str->_M_dataplus)._M_p + (long)pcVar13);
          if (bVar6) {
            index = pcVar13 + targetStr._M_dataplus._M_p;
            goto LAB_0018b622;
          }
        }
        std::__cxx11::string::string((string *)&local_a8,"indent mismatch",(allocator *)&local_120);
        local_108._M_dataplus._M_p = (pointer)0x0;
        local_108._M_string_length = 0;
        local_108.field_2._M_allocated_capacity = 0;
        ParserContext::errorAtInnerToken
                  ((ParserContext *)targetStr.field_2._8_8_,Error,token,(size_t)pcVar13,
                   (size_t)pcVar13,&local_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_108);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::string((string *)local_c8,"",(allocator *)&local_a8);
        goto LAB_0018b6f6;
      }
      sVar10 = byteCount(str,(size_t)index);
      _Var12._M_current = (str->_M_dataplus)._M_p + (long)index;
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)auStack_88,_Var12,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(_Var12._M_current + sVar10));
      index = index + sVar10;
LAB_0018b622:
      pcVar13 = (pointer)(token->literal)._M_string_length;
    }
    local_c8._0_8_ = local_c8 + 0x10;
    if (auStack_88 == (undefined1  [8])psVar1) {
      local_c8._24_8_ = ret_1.field_2._M_allocated_capacity;
    }
    else {
      local_c8._0_8_ = auStack_88;
    }
    local_c8._16_8_ = ret_1._M_string_length;
    local_c8._8_8_ = ret_1._M_dataplus._M_p;
    ret_1._M_dataplus._M_p = (pointer)0x0;
    ret_1._M_string_length = ret_1._M_string_length & 0xffffffffffffff00;
    auStack_88 = (undefined1  [8])psVar1;
LAB_0018b6f6:
    std::__cxx11::string::~string((string *)auStack_88);
    std::__cxx11::string::~string((string *)local_60);
    this_00 = (string *)local_c8;
  }
  std::__cxx11::string::operator=((string *)&(local_38._M_head_impl)->vString,this_00);
  std::__cxx11::string::~string(this_00);
LAB_0018b43f:
  std::make_shared<chatra::Node>();
  sVar10 = idx;
  puVar5 = *(undefined1 **)idx;
  *puVar5 = 0x1a;
  local_60 = (undefined1  [8])token;
  std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
  emplace_back<chatra::Token_const*>
            ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)(puVar5 + 0x18),
             (Token **)local_60);
  __p._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (Literal *)0x0;
  std::__uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>::reset
            ((__uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_> *)
             (*(long *)sVar10 + 0x38),__p._M_head_impl);
  std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::~unique_ptr
            ((unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_> *)&local_38);
  sVar14.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar14.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)sVar10;
  return (shared_ptr<chatra::Node>)
         sVar14.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseAsLiteral(ParserContext& ct, const Token& token) {
	auto& t = token.literal;

	std::unique_ptr<Literal> value(new Literal());

	if (token.type == TokenType::Number) {
		if (startsWith(t, 0, "0x")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "hexadecimal", 16);
		}
		else if (startsWith(t, 0, "0b")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "binary", 2);
		}
		else if (t.find('.') != std::string::npos) {
			value->type = LiteralType::Float;
			value->vFloat = parseFloatLiteral(ct, token, t, 0);
		}
		else {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 0, "decimal", 10);
		}
	}
	else if (token.type == TokenType::Name) {
		if (token.sid == StringId::Null)
			value->type = LiteralType::Null;
		else {
			value->type = LiteralType::Bool;
			value->vBool = parseBooleanLiteral(ct, token, token.sid);
		}
	}
	else if (token.type == TokenType::String) {
		value->type = LiteralType::String;
		if (startsWith(t, 0, "'") || startsWith(t, 0, "\""))
			 value->vString = parseStringLiteral(ct, token, t, 0);
		else if (startsWith(t, 0, "L'") || startsWith(t, 0, "L\"")) {
			value->type = LiteralType ::MultilingualString;
			value->vString = parseStringLiteral(ct, token, t, 1);
		}
		else if (startsWith(t, 0, "r'") || startsWith(t, 0, "r\""))
			value->vString = parseRegexpStringLiteral(t, 1);
		else if (startsWith(t, 0, "R<<<\n"))
			value->vString = parseRawStringLiteral(ct, token, t, 5);
	}
	else {
		ct.errorAtToken(ErrorLevel::Error, token, "internal error", {});
		throw AbortCompilingException();
	}

	std::shared_ptr<Node> n = std::make_shared<Node>();
	n->type = NodeType::Literal;
	n->tokens.push_back(&token);
	n->literalValue = std::move(value);
	return n;
}